

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::i2p_alert::message_abi_cxx11_(string *__return_storage_ptr__,i2p_alert *this)

{
  error_category *peVar1;
  int iVar2;
  undefined4 extraout_var;
  char msg [600];
  string sStack_2b8;
  string local_298;
  char local_278 [600];
  
  iVar2 = (**((this->error).cat_)->_vptr_error_category)();
  peVar1 = (this->error).cat_;
  (*peVar1->_vptr_error_category[4])(&sStack_2b8,peVar1,(ulong)(uint)(this->error).val_);
  convert_from_native(&local_298,&sStack_2b8);
  snprintf(local_278,600,"i2p_error: [%s] %s",CONCAT44(extraout_var,iVar2),
           local_298._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&sStack_2b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_278,(allocator<char> *)&local_298);
  return __return_storage_ptr__;
}

Assistant:

std::string i2p_alert::message() const
	{
		char msg[600];
		std::snprintf(msg, sizeof(msg), "i2p_error: [%s] %s"
			, error.category().name(), convert_from_native(error.message()).c_str());
		return msg;
	}